

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QList<QSize> * QGenericUnixTheme::availableXdgFileIconSizes(void)

{
  QList<QSize> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QIcon local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"inode-directory";
  local_60.size = 0;
  local_48.size = 0xf;
  QIcon::fromTheme(&local_30,(QString *)&local_48);
  QIcon::availableSizes(in_RDI,&local_30,Normal,Off);
  QIcon::~QIcon(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSize> QGenericUnixTheme::availableXdgFileIconSizes()
{
    return QIcon::fromTheme(QStringLiteral("inode-directory")).availableSizes();
}